

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * Splash_abi_cxx11_(void)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  string *in_RDI;
  allocator<char> local_9;
  
  uVar2 = std::chrono::_V2::system_clock::now();
  uVar3 = uVar2 / 0x7fffffff << 0x1f | uVar2 / 0x7fffffff;
  uVar4 = (ulong)(uVar3 + uVar2 + (uint)(uVar2 + uVar3 == 0)) * 0x41a7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  lVar5 = (ulong)(SUB164(auVar1 * ZEXT816(0x400000008001),8) >> 0xd) * -0x7fffffff + uVar4;
  uVar2 = (uint)((ulong)(lVar5 * 0x92492493) >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             _ZL8splashes_rel +
             *(int *)(_ZL8splashes_rel + (ulong)((uVar2 >> 2) + (uVar2 >> 2) * -8 + (int)lVar5) * 4)
             ,&local_9);
  return in_RDI;
}

Assistant:

std::string Splash()
{
    std::default_random_engine randomizer;
    unsigned seed = (unsigned) std::chrono::system_clock::now().time_since_epoch().count();
    randomizer.seed(seed);
    unsigned index = randomizer() % (sizeof(splashes) / sizeof(const char*));
    return std::string(splashes[index]);
}